

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  int iVar11;
  ulong uVar12;
  Scene *pSVar13;
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  Geometry *pGVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  int iVar29;
  undefined4 uVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  long lVar32;
  RTCFilterFunctionN p_Var33;
  RTCRayN *pRVar34;
  byte bVar35;
  ulong uVar36;
  ulong uVar37;
  uint *puVar38;
  ulong uVar39;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar40;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar57;
  undefined1 auVar58 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar66;
  float fVar67;
  float fVar91;
  float fVar93;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar124;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar125;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar135;
  float fVar137;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar136;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  undefined1 auVar151 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  vbool<4> valid;
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1400;
  float fStack_13fc;
  undefined8 local_13f8;
  Scene *scene;
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  RTCFilterFunctionNArguments args;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float fStack_130c;
  vfloat<4> tNear;
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  float local_1268 [4];
  float local_1258 [4];
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  float local_1238 [4];
  uint local_1228;
  uint uStack_1224;
  uint uStack_1220;
  uint uStack_121c;
  undefined1 local_1218 [16];
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  long local_11a0;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [8];
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [8];
  float fStack_1150;
  float fStack_114c;
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  uint local_1108;
  uint uStack_1104;
  uint uStack_1100;
  uint uStack_10fc;
  uint local_10f8;
  uint uStack_10f4;
  uint uStack_10f0;
  uint uStack_10ec;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar40 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar95 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar92 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar94 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar165 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar169 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar174 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar152 = fVar165 * 0.99999964;
  fVar187 = fVar169 * 0.99999964;
  fVar150 = fVar174 * 0.99999964;
  fVar165 = fVar165 * 1.0000004;
  fVar169 = fVar169 * 1.0000004;
  fVar174 = fVar174 * 1.0000004;
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar29 = (tray->tnear).field_0.i[k];
  auVar141._4_4_ = iVar29;
  auVar141._0_4_ = iVar29;
  auVar141._8_4_ = iVar29;
  auVar141._12_4_ = iVar29;
  iVar29 = (tray->tfar).field_0.i[k];
  auVar167._4_4_ = iVar29;
  auVar167._0_4_ = iVar29;
  auVar167._8_4_ = iVar29;
  auVar167._12_4_ = iVar29;
  auVar68._8_4_ = 0xffffffff;
  auVar68._0_8_ = 0xffffffffffffffff;
  auVar68._12_4_ = 0xffffffff;
  local_10b8 = mm_lookupmask_ps._0_16_;
  local_10d8 = mm_lookupmask_ps._0_16_ ^ auVar68;
  bVar35 = (byte)k;
  local_10c8 = mm_lookupmask_ps._240_16_;
  local_10e8 = mm_lookupmask_ps._240_16_ ^ auVar68;
  local_1048 = fVar95;
  fStack_1044 = fVar95;
  fStack_1040 = fVar95;
  fStack_103c = fVar95;
  local_1058 = fVar92;
  fStack_1054 = fVar92;
  fStack_1050 = fVar92;
  fStack_104c = fVar92;
  local_1068 = fVar94;
  fStack_1064 = fVar94;
  fStack_1060 = fVar94;
  fStack_105c = fVar94;
  local_1078 = fVar165;
  fStack_1074 = fVar165;
  fStack_1070 = fVar165;
  fStack_106c = fVar165;
  local_1088 = fVar169;
  fStack_1084 = fVar169;
  fStack_1080 = fVar169;
  fStack_107c = fVar169;
  local_1098 = fVar174;
  fStack_1094 = fVar174;
  fStack_1090 = fVar174;
  fStack_108c = fVar174;
  local_1188 = fVar150;
  fStack_1184 = fVar150;
  fStack_1180 = fVar150;
  fStack_117c = fVar150;
  local_1198 = fVar152;
  fStack_1194 = fVar152;
  fStack_1190 = fVar152;
  fStack_118c = fVar152;
  local_10a8 = fVar187;
  fStack_10a4 = fVar187;
  fStack_10a0 = fVar187;
  fStack_109c = fVar187;
  local_1218 = auVar141;
  fVar67 = fVar95;
  fVar91 = fVar95;
  fVar93 = fVar95;
  fVar175 = fVar169;
  fVar178 = fVar169;
  fVar181 = fVar169;
  fVar184 = fVar174;
  fVar112 = fVar174;
  fVar124 = fVar174;
  fVar125 = fVar187;
  fVar126 = fVar187;
  fVar127 = fVar187;
  fVar135 = fVar150;
  fVar136 = fVar150;
  fVar137 = fVar150;
  fVar153 = fVar152;
  fVar154 = fVar152;
  fVar155 = fVar152;
  fVar156 = fVar92;
  fVar157 = fVar92;
  fVar158 = fVar92;
  fVar159 = fVar94;
  fVar160 = fVar94;
  fVar161 = fVar94;
  fVar162 = fVar165;
  fVar163 = fVar165;
  fVar176 = fVar165;
LAB_006556a5:
  do {
    do {
      if (pSVar40 == stack) {
        return;
      }
      pSVar31 = pSVar40 + -1;
      pSVar40 = pSVar40 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar31->dist &&
             (float)pSVar31->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar31 = stack;
    pSVar41 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar40->ptr).ptr;
    while (((ulong)pSVar41 & 8) == 0) {
      pfVar10 = (float *)((long)&pSVar41[2].ptr.ptr + uVar39);
      auVar96._0_4_ = (*pfVar10 - fVar95) * fVar152;
      auVar96._4_4_ = (pfVar10[1] - fVar67) * fVar153;
      auVar96._8_4_ = (pfVar10[2] - fVar91) * fVar154;
      auVar96._12_4_ = (pfVar10[3] - fVar93) * fVar155;
      pfVar10 = (float *)((long)&pSVar41[2].ptr.ptr + uVar37);
      auVar139._0_4_ = (*pfVar10 - fVar92) * fVar187;
      auVar139._4_4_ = (pfVar10[1] - fVar156) * fVar125;
      auVar139._8_4_ = (pfVar10[2] - fVar157) * fVar126;
      auVar139._12_4_ = (pfVar10[3] - fVar158) * fVar127;
      auVar68 = maxps(auVar96,auVar139);
      pfVar10 = (float *)((long)&pSVar41[2].ptr.ptr + uVar36);
      auVar148._0_4_ = (*pfVar10 - fVar94) * fVar150;
      auVar148._4_4_ = (pfVar10[1] - fVar159) * fVar135;
      auVar148._8_4_ = (pfVar10[2] - fVar160) * fVar136;
      auVar148._12_4_ = (pfVar10[3] - fVar161) * fVar137;
      auVar96 = maxps(auVar148,auVar141);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar68,auVar96);
      pfVar10 = (float *)((long)&pSVar41[2].ptr.ptr + (uVar39 ^ 0x10));
      auVar97._0_4_ = (*pfVar10 - fVar95) * fVar165;
      auVar97._4_4_ = (pfVar10[1] - fVar67) * fVar162;
      auVar97._8_4_ = (pfVar10[2] - fVar91) * fVar163;
      auVar97._12_4_ = (pfVar10[3] - fVar93) * fVar176;
      pfVar10 = (float *)((long)&pSVar41[2].ptr.ptr + (uVar37 ^ 0x10));
      auVar113._0_4_ = (*pfVar10 - fVar92) * fVar169;
      auVar113._4_4_ = (pfVar10[1] - fVar156) * fVar175;
      auVar113._8_4_ = (pfVar10[2] - fVar157) * fVar178;
      auVar113._12_4_ = (pfVar10[3] - fVar158) * fVar181;
      auVar68 = minps(auVar97,auVar113);
      pfVar10 = (float *)((long)&pSVar41[2].ptr.ptr + (uVar36 ^ 0x10));
      auVar114._0_4_ = (*pfVar10 - fVar94) * fVar174;
      auVar114._4_4_ = (pfVar10[1] - fVar159) * fVar184;
      auVar114._8_4_ = (pfVar10[2] - fVar160) * fVar112;
      auVar114._12_4_ = (pfVar10[3] - fVar161) * fVar124;
      auVar96 = minps(auVar114,auVar167);
      auVar68 = minps(auVar68,auVar96);
      auVar131._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar68._4_4_);
      auVar131._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar68._0_4_);
      auVar131._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar68._8_4_);
      auVar131._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar68._12_4_);
      uVar28 = movmskps((int)pSVar31,auVar131);
      if (uVar28 == 0) goto LAB_006556a5;
      uVar28 = uVar28 & 0xff;
      uVar42 = (ulong)pSVar41 & 0xfffffffffffffff0;
      lVar20 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      pSVar31 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar42 + lVar20 * 8);
      uVar28 = uVar28 - 1 & uVar28;
      pSVar41 = pSVar31;
      if (uVar28 != 0) {
        uVar43 = tNear.field_0.i[lVar20];
        lVar20 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
          }
        }
        pSVar41 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar42 + lVar20 * 8);
        uVar44 = tNear.field_0.i[lVar20];
        uVar28 = uVar28 - 1 & uVar28;
        if (uVar28 == 0) {
          if (uVar43 < uVar44) {
            (pSVar40->ptr).ptr = (size_t)pSVar41;
            pSVar40->dist = uVar44;
            pSVar40 = pSVar40 + 1;
            pSVar41 = pSVar31;
          }
          else {
            (pSVar40->ptr).ptr = (size_t)pSVar31;
            pSVar40->dist = uVar43;
            pSVar31 = pSVar41;
            pSVar40 = pSVar40 + 1;
          }
        }
        else {
          auVar69._8_4_ = uVar43;
          auVar69._0_8_ = pSVar31;
          auVar69._12_4_ = 0;
          auVar98._8_4_ = uVar44;
          auVar98._0_8_ = pSVar41;
          auVar98._12_4_ = 0;
          lVar20 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar12 = *(ulong *)(uVar42 + lVar20 * 8);
          iVar29 = tNear.field_0.i[lVar20];
          auVar115._8_4_ = iVar29;
          auVar115._0_8_ = uVar12;
          auVar115._12_4_ = 0;
          auVar128._8_4_ = -(uint)((int)uVar43 < (int)uVar44);
          uVar28 = uVar28 - 1 & uVar28;
          auVar141 = local_1218;
          if (uVar28 == 0) {
            auVar128._4_4_ = auVar128._8_4_;
            auVar128._0_4_ = auVar128._8_4_;
            auVar128._12_4_ = auVar128._8_4_;
            auVar68 = auVar69 & auVar128 | ~auVar128 & auVar98;
            auVar96 = auVar98 & auVar128 | ~auVar128 & auVar69;
            auVar129._8_4_ = -(uint)(auVar68._8_4_ < iVar29);
            auVar129._0_8_ = CONCAT44(auVar129._8_4_,auVar129._8_4_);
            auVar129._12_4_ = auVar129._8_4_;
            pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)
                      (~auVar129._0_8_ & uVar12 | auVar68._0_8_ & auVar129._0_8_);
            auVar68 = auVar115 & auVar129 | ~auVar129 & auVar68;
            auVar70._8_4_ = -(uint)(auVar96._8_4_ < auVar68._8_4_);
            auVar70._4_4_ = auVar70._8_4_;
            auVar70._0_4_ = auVar70._8_4_;
            auVar70._12_4_ = auVar70._8_4_;
            *pSVar40 = (StackItemT<embree::NodeRefPtr<4>_>)(~auVar70 & auVar96 | auVar68 & auVar70);
            pSVar40[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar96 & auVar70 | ~auVar70 & auVar68);
            pSVar40 = pSVar40 + 2;
            pSVar41 = pSVar31;
          }
          else {
            lVar20 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            iVar11 = tNear.field_0.i[lVar20];
            auVar138._8_4_ = iVar11;
            auVar138._0_8_ = *(undefined8 *)(uVar42 + lVar20 * 8);
            auVar138._12_4_ = 0;
            auVar130._4_4_ = auVar128._8_4_;
            auVar130._0_4_ = auVar128._8_4_;
            auVar130._8_4_ = auVar128._8_4_;
            auVar130._12_4_ = auVar128._8_4_;
            auVar68 = auVar69 & auVar130 | ~auVar130 & auVar98;
            auVar96 = auVar98 & auVar130 | ~auVar130 & auVar69;
            auVar147._0_4_ = -(uint)(iVar29 < iVar11);
            auVar147._4_4_ = -(uint)(iVar29 < iVar11);
            auVar147._8_4_ = -(uint)(iVar29 < iVar11);
            auVar147._12_4_ = -(uint)(iVar29 < iVar11);
            auVar131 = auVar115 & auVar147 | ~auVar147 & auVar138;
            auVar148 = ~auVar147 & auVar115 | auVar138 & auVar147;
            auVar116._8_4_ = -(uint)(auVar96._8_4_ < auVar148._8_4_);
            auVar116._4_4_ = auVar116._8_4_;
            auVar116._0_4_ = auVar116._8_4_;
            auVar116._12_4_ = auVar116._8_4_;
            auVar139 = auVar96 & auVar116 | ~auVar116 & auVar148;
            auVar99._8_4_ = -(uint)(auVar68._8_4_ < auVar131._8_4_);
            auVar99._0_8_ = CONCAT44(auVar99._8_4_,auVar99._8_4_);
            auVar99._12_4_ = auVar99._8_4_;
            pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)
                      (auVar68._0_8_ & auVar99._0_8_ | ~auVar99._0_8_ & auVar131._0_8_);
            auVar68 = ~auVar99 & auVar68 | auVar131 & auVar99;
            auVar71._8_4_ = -(uint)(auVar68._8_4_ < auVar139._8_4_);
            auVar71._4_4_ = auVar71._8_4_;
            auVar71._0_4_ = auVar71._8_4_;
            auVar71._12_4_ = auVar71._8_4_;
            *pSVar40 = (StackItemT<embree::NodeRefPtr<4>_>)
                       (~auVar116 & auVar96 | auVar148 & auVar116);
            pSVar40[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar71 & auVar68 | auVar139 & auVar71);
            pSVar40[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar68 & auVar71 | ~auVar71 & auVar139);
            pSVar40 = pSVar40 + 3;
            pSVar41 = pSVar31;
            fVar150 = local_1188;
            fVar135 = fStack_1184;
            fVar136 = fStack_1180;
            fVar137 = fStack_117c;
            fVar152 = local_1198;
            fVar153 = fStack_1194;
            fVar154 = fStack_1190;
            fVar155 = fStack_118c;
          }
        }
      }
    }
    local_11a8 = (ulong)((uint)pSVar41 & 0xf) - 8;
    for (local_11a0 = 0; local_11a0 != local_11a8; local_11a0 = local_11a0 + 1) {
      lVar32 = local_11a0 * 0x60;
      pSVar13 = context->scene;
      puVar1 = (uint *)(((ulong)pSVar41 & 0xfffffffffffffff0) + lVar32);
      puVar38 = puVar1 + 0x10;
      ppfVar14 = (pSVar13->vertices).items;
      pfVar15 = ppfVar14[*puVar38];
      uVar24 = *(undefined8 *)(pfVar15 + puVar1[4]);
      uVar25 = *(undefined8 *)(pfVar15 + puVar1[4] + 2);
      local_1418 = (float)uVar24;
      fStack_1414 = (float)((ulong)uVar24 >> 0x20);
      fStack_1410 = (float)uVar25;
      fStack_140c = (float)((ulong)uVar25 >> 0x20);
      pfVar10 = pfVar15 + puVar1[0xc];
      pfVar16 = ppfVar14[puVar1[0x11]];
      pfVar2 = pfVar16 + puVar1[5];
      fVar174 = pfVar2[2];
      pfVar3 = pfVar16 + puVar1[0xd];
      pfVar17 = ppfVar14[puVar1[0x12]];
      pfVar4 = pfVar17 + puVar1[2];
      pfVar5 = pfVar17 + puVar1[6];
      pfVar6 = pfVar17 + puVar1[0xe];
      pfVar18 = ppfVar14[puVar1[0x13]];
      pfVar7 = pfVar18 + puVar1[3];
      pfVar8 = pfVar18 + puVar1[7];
      pfVar9 = pfVar18 + puVar1[0xf];
      local_13f8 = CONCAT44(*pfVar7,*pfVar4);
      local_11b8 = CONCAT44(pfVar16[(ulong)puVar1[9] + 2],pfVar15[(ulong)puVar1[8] + 2]);
      local_11a8 = CONCAT44(pfVar18[(ulong)puVar1[0xb] + 2],pfVar17[(ulong)puVar1[10] + 2]);
      local_11c8 = pfVar15[(ulong)puVar1[8] + 1];
      fStack_11c4 = pfVar16[(ulong)puVar1[9] + 1];
      fStack_11c0 = pfVar17[(ulong)puVar1[10] + 1];
      fStack_11bc = pfVar18[(ulong)puVar1[0xb] + 1];
      fVar95 = *(float *)(ray + k * 4);
      fVar92 = *(float *)(ray + k * 4 + 0x10);
      fVar126 = pfVar5[2] - fVar95;
      fVar135 = pfVar8[2] - fVar95;
      fVar137 = fStack_1400 - fVar95;
      fVar150 = fStack_13fc - fVar95;
      local_11e8 = local_1418;
      fStack_11e4 = *pfVar2;
      local_11d8._4_4_ = *pfVar8;
      local_11d8._0_4_ = *pfVar5;
      local_1418 = local_1418 - fVar95;
      fVar153 = *pfVar2 - fVar95;
      fVar154 = *pfVar5 - fVar95;
      fVar155 = *pfVar8 - fVar95;
      local_f88 = CONCAT44(*pfVar3,*pfVar10);
      stack[0].ptr.ptr._4_4_ = *pfVar9;
      stack[0].ptr.ptr._0_4_ = *pfVar6;
      fVar67 = *pfVar10 - fVar95;
      fVar91 = *pfVar3 - fVar95;
      fVar93 = *pfVar6 - fVar95;
      fVar95 = *pfVar9 - fVar95;
      fStack_130c = *(float *)(ray + k * 4 + 0x20);
      local_f98 = pfVar15[(ulong)*puVar1 + 1] - fVar92;
      fStack_f94 = pfVar16[(ulong)puVar1[1] + 1] - fVar92;
      fStack_f90 = pfVar4[1] - fVar92;
      fStack_f8c = pfVar7[1] - fVar92;
      fVar156 = pfVar15[(ulong)*puVar1 + 2] - fStack_130c;
      fVar158 = pfVar16[(ulong)puVar1[1] + 2] - fStack_130c;
      fVar160 = pfVar4[2] - fStack_130c;
      fVar162 = pfVar7[2] - fStack_130c;
      local_1018 = pfVar10[1];
      fStack_1014 = pfVar3[1];
      fStack_1010 = pfVar6[1];
      fStack_100c = pfVar9[1];
      local_1368 = pfVar10[1] - fVar92;
      fStack_1364 = pfVar3[1] - fVar92;
      fStack_1360 = pfVar6[1] - fVar92;
      fStack_135c = pfVar9[1] - fVar92;
      local_ff8 = pfVar10[2];
      fStack_ff4 = pfVar3[2];
      fStack_ff0 = pfVar6[2];
      fStack_fec = pfVar9[2];
      fVar175 = pfVar10[2] - fStack_130c;
      fVar178 = pfVar3[2] - fStack_130c;
      fVar181 = pfVar6[2] - fStack_130c;
      fVar184 = pfVar9[2] - fStack_130c;
      local_fa8 = fVar67 - fVar126;
      fStack_fa4 = fVar91 - fVar135;
      fStack_fa0 = fVar93 - fVar137;
      fStack_f9c = fVar95 - fVar150;
      local_fc8 = local_1368 - local_f98;
      fStack_fc4 = fStack_1364 - fStack_f94;
      fStack_fc0 = fStack_1360 - fStack_f90;
      fStack_fbc = fStack_135c - fStack_f8c;
      local_fb8 = fVar175 - fVar156;
      fStack_fb4 = fVar178 - fVar158;
      fStack_fb0 = fVar181 - fVar160;
      fStack_fac = fVar184 - fVar162;
      fVar94 = *(float *)(ray + k * 4 + 0x50);
      fVar165 = *(float *)(ray + k * 4 + 0x60);
      fVar169 = *(float *)(ray + k * 4 + 0x40);
      fVar127 = (local_fc8 * (fVar175 + fVar156) - (local_1368 + local_f98) * local_fb8) * fVar169 +
                ((fVar67 + fVar126) * local_fb8 - (fVar175 + fVar156) * local_fa8) * fVar94 +
                (local_fa8 * (local_1368 + local_f98) - (fVar67 + fVar126) * local_fc8) * fVar165;
      fVar136 = (fStack_fc4 * (fVar178 + fVar158) - (fStack_1364 + fStack_f94) * fStack_fb4) *
                fVar169 + ((fVar91 + fVar135) * fStack_fb4 - (fVar178 + fVar158) * fStack_fa4) *
                          fVar94 + (fStack_fa4 * (fStack_1364 + fStack_f94) -
                                   (fVar91 + fVar135) * fStack_fc4) * fVar165;
      tNear.field_0._0_8_ = CONCAT44(fVar136,fVar127);
      tNear.field_0.v[2] =
           (fStack_fc0 * (fVar181 + fVar160) - (fStack_1360 + fStack_f90) * fStack_fb0) * fVar169 +
           ((fVar93 + fVar137) * fStack_fb0 - (fVar181 + fVar160) * fStack_fa0) * fVar94 +
           (fStack_fa0 * (fStack_1360 + fStack_f90) - (fVar93 + fVar137) * fStack_fc0) * fVar165;
      tNear.field_0.v[3] =
           (fStack_fbc * (fVar184 + fVar162) - (fStack_135c + fStack_f8c) * fStack_fac) * fVar169 +
           ((fVar95 + fVar150) * fStack_fac - (fVar184 + fVar162) * fStack_f9c) * fVar94 +
           (fStack_f9c * (fStack_135c + fStack_f8c) - (fVar95 + fVar150) * fStack_fbc) * fVar165;
      local_1008 = fStack_1414;
      fStack_1004 = pfVar2[1];
      fStack_1000 = pfVar5[1];
      fStack_ffc = pfVar8[1];
      local_11f8 = fVar92;
      fStack_11f4 = fVar92;
      fStack_11f0 = fVar92;
      fStack_11ec = fVar92;
      local_1208 = fStack_1414 - fVar92;
      fStack_1204 = pfVar2[1] - fVar92;
      fStack_1200 = pfVar5[1] - fVar92;
      fStack_11fc = pfVar8[1] - fVar92;
      local_1348 = fStack_1410 - fStack_130c;
      fStack_1344 = fVar174 - fStack_130c;
      fStack_1340 = fStack_1410 - fStack_130c;
      fStack_133c = fStack_140c - fStack_130c;
      fVar176 = fVar126 - local_1418;
      fVar179 = fVar135 - fVar153;
      fVar182 = fVar137 - fVar154;
      fVar185 = fVar150 - fVar155;
      fVar112 = local_f98 - local_1208;
      fVar124 = fStack_f94 - fStack_1204;
      fVar187 = fStack_f90 - fStack_1200;
      fVar125 = fStack_f8c - fStack_11fc;
      local_fd8 = fVar156 - local_1348;
      fStack_fd4 = fVar158 - fStack_1344;
      fStack_fd0 = fVar160 - fStack_1340;
      fStack_fcc = fVar162 - fStack_133c;
      local_1028._0_4_ =
           (fVar112 * (fVar156 + local_1348) - (local_f98 + local_1208) * local_fd8) * fVar169 +
           ((fVar126 + local_1418) * local_fd8 - (fVar156 + local_1348) * fVar176) * fVar94 +
           (fVar176 * (local_f98 + local_1208) - (fVar126 + local_1418) * fVar112) * fVar165;
      local_1028._4_4_ =
           (fVar124 * (fVar158 + fStack_1344) - (fStack_f94 + fStack_1204) * fStack_fd4) * fVar169 +
           ((fVar135 + fVar153) * fStack_fd4 - (fVar158 + fStack_1344) * fVar179) * fVar94 +
           (fVar179 * (fStack_f94 + fStack_1204) - (fVar135 + fVar153) * fVar124) * fVar165;
      local_1028._8_4_ =
           (fVar187 * (fVar160 + fStack_1340) - (fStack_f90 + fStack_1200) * fStack_fd0) * fVar169 +
           ((fVar137 + fVar154) * fStack_fd0 - (fVar160 + fStack_1340) * fVar182) * fVar94 +
           (fVar182 * (fStack_f90 + fStack_1200) - (fVar137 + fVar154) * fVar187) * fVar165;
      local_1028._12_4_ =
           (fVar125 * (fVar162 + fStack_133c) - (fStack_f8c + fStack_11fc) * fStack_fcc) * fVar169 +
           ((fVar150 + fVar155) * fStack_fcc - (fVar162 + fStack_133c) * fVar185) * fVar94 +
           (fVar185 * (fStack_f8c + fStack_11fc) - (fVar150 + fVar155) * fVar125) * fVar165;
      fVar157 = local_1418 - fVar67;
      fVar159 = fVar153 - fVar91;
      fVar161 = fVar154 - fVar93;
      fVar163 = fVar155 - fVar95;
      local_fe8 = local_1208 - local_1368;
      fStack_fe4 = fStack_1204 - fStack_1364;
      fStack_fe0 = fStack_1200 - fStack_1360;
      fStack_fdc = fStack_11fc - fStack_135c;
      fVar188 = local_1348 - fVar175;
      fVar189 = fStack_1344 - fVar178;
      fVar190 = fStack_1340 - fVar181;
      fVar191 = fStack_133c - fVar184;
      local_1338 = local_1208 + local_1368;
      fStack_1334 = fStack_1204 + fStack_1364;
      fStack_1330 = fStack_1200 + fStack_1360;
      fStack_132c = fStack_11fc + fStack_135c;
      local_1328 = local_1348 + fVar175;
      fStack_1324 = fStack_1344 + fVar178;
      fStack_1320 = fStack_1340 + fVar181;
      fStack_131c = fStack_133c + fVar184;
      auVar54._0_4_ =
           (local_fe8 * local_1328 - local_1338 * fVar188) * fVar169 +
           ((fVar67 + local_1418) * fVar188 - fVar157 * local_1328) * fVar94 +
           (fVar157 * local_1338 - (fVar67 + local_1418) * local_fe8) * fVar165;
      auVar54._4_4_ =
           (fStack_fe4 * fStack_1324 - fStack_1334 * fVar189) * fVar169 +
           ((fVar91 + fVar153) * fVar189 - fVar159 * fStack_1324) * fVar94 +
           (fVar159 * fStack_1334 - (fVar91 + fVar153) * fStack_fe4) * fVar165;
      auVar54._8_4_ =
           (fStack_fe0 * fStack_1320 - fStack_1330 * fVar190) * fVar169 +
           ((fVar93 + fVar154) * fVar190 - fVar161 * fStack_1320) * fVar94 +
           (fVar161 * fStack_1330 - (fVar93 + fVar154) * fStack_fe0) * fVar165;
      auVar54._12_4_ =
           (fStack_fdc * fStack_131c - fStack_132c * fVar191) * fVar169 +
           ((fVar95 + fVar155) * fVar191 - fVar163 * fStack_131c) * fVar94 +
           (fVar163 * fStack_132c - (fVar95 + fVar155) * fStack_fdc) * fVar165;
      fVar153 = fVar127 + local_1028._0_4_ + auVar54._0_4_;
      fVar154 = fVar136 + local_1028._4_4_ + auVar54._4_4_;
      fVar155 = tNear.field_0.v[2] + local_1028._8_4_ + auVar54._8_4_;
      fVar152 = tNear.field_0.v[3] + local_1028._12_4_ + auVar54._12_4_;
      auVar140._8_4_ = tNear.field_0.i[2];
      auVar140._0_8_ = tNear.field_0._0_8_;
      auVar140._12_4_ = tNear.field_0.i[3];
      auVar141 = minps(auVar140,local_1028);
      auVar141 = minps(auVar141,auVar54);
      auVar166._8_4_ = tNear.field_0.i[2];
      auVar166._0_8_ = tNear.field_0._0_8_;
      auVar166._12_4_ = tNear.field_0.i[3];
      auVar167 = maxps(auVar166,local_1028);
      auVar167 = maxps(auVar167,auVar54);
      fVar95 = ABS(fVar153) * 1.1920929e-07;
      fVar67 = ABS(fVar154) * 1.1920929e-07;
      fVar91 = ABS(fVar155) * 1.1920929e-07;
      fVar93 = ABS(fVar152) * 1.1920929e-07;
      auVar168._4_4_ = -(uint)(auVar167._4_4_ <= fVar67);
      auVar168._0_4_ = -(uint)(auVar167._0_4_ <= fVar95);
      auVar168._8_4_ = -(uint)(auVar167._8_4_ <= fVar91);
      auVar168._12_4_ = -(uint)(auVar167._12_4_ <= fVar93);
      auVar142._4_4_ = -(uint)(-fVar67 <= auVar141._4_4_);
      auVar142._0_4_ = -(uint)(-fVar95 <= auVar141._0_4_);
      auVar142._8_4_ = -(uint)(-fVar91 <= auVar141._8_4_);
      auVar142._12_4_ = -(uint)(-fVar93 <= auVar141._12_4_);
      auVar168 = auVar168 | auVar142;
      lVar20 = ((ulong)pSVar41 & 0xfffffffffffffff0) + lVar32;
      iVar29 = movmskps((int)lVar32,auVar168);
      if (iVar29 == 0) {
LAB_00657295:
        uVar28 = 0;
        auVar104._4_4_ = fStack_1204;
        auVar104._0_4_ = local_1208;
        auVar104._8_4_ = fStack_1200;
        auVar104._12_4_ = fStack_11fc;
      }
      else {
        local_1038 = fVar153;
        fStack_1034 = fVar154;
        fStack_1030 = fVar155;
        fStack_102c = fVar152;
        uVar28 = -(uint)(ABS(local_fe8 * local_fd8) <= ABS(fVar112 * local_fb8));
        uVar45 = -(uint)(ABS(fStack_fe4 * fStack_fd4) <= ABS(fVar124 * fStack_fb4));
        uVar48 = -(uint)(ABS(fStack_fe0 * fStack_fd0) <= ABS(fVar187 * fStack_fb0));
        uVar51 = -(uint)(ABS(fStack_fdc * fStack_fcc) <= ABS(fVar125 * fStack_fac));
        uVar43 = -(uint)(ABS(fVar176 * fVar188) <= ABS(local_fa8 * local_fd8));
        uVar46 = -(uint)(ABS(fVar179 * fVar189) <= ABS(fStack_fa4 * fStack_fd4));
        uVar49 = -(uint)(ABS(fVar182 * fVar190) <= ABS(fStack_fa0 * fStack_fd0));
        uVar52 = -(uint)(ABS(fVar185 * fVar191) <= ABS(fStack_f9c * fStack_fcc));
        uVar44 = -(uint)(ABS(fVar157 * fVar112) <= ABS(fVar176 * local_fc8));
        uVar47 = -(uint)(ABS(fVar159 * fVar124) <= ABS(fVar179 * fStack_fc4));
        uVar50 = -(uint)(ABS(fVar161 * fVar187) <= ABS(fVar182 * fStack_fc0));
        uVar53 = -(uint)(ABS(fVar163 * fVar125) <= ABS(fVar185 * fStack_fbc));
        local_1258[0] =
             (float)(~uVar28 & (uint)(local_fc8 * local_fd8 - fVar112 * local_fb8) |
                    (uint)(fVar112 * fVar188 - local_fe8 * local_fd8) & uVar28);
        local_1258[1] =
             (float)(~uVar45 & (uint)(fStack_fc4 * fStack_fd4 - fVar124 * fStack_fb4) |
                    (uint)(fVar124 * fVar189 - fStack_fe4 * fStack_fd4) & uVar45);
        local_1258[2] =
             (float)(~uVar48 & (uint)(fStack_fc0 * fStack_fd0 - fVar187 * fStack_fb0) |
                    (uint)(fVar187 * fVar190 - fStack_fe0 * fStack_fd0) & uVar48);
        local_1258[3] =
             (float)(~uVar51 & (uint)(fStack_fbc * fStack_fcc - fVar125 * fStack_fac) |
                    (uint)(fVar125 * fVar191 - fStack_fdc * fStack_fcc) & uVar51);
        auVar143._0_4_ = ~uVar43 & (uint)(local_fb8 * fVar176 - local_fa8 * local_fd8);
        auVar143._4_4_ = ~uVar46 & (uint)(fStack_fb4 * fVar179 - fStack_fa4 * fStack_fd4);
        auVar143._8_4_ = ~uVar49 & (uint)(fStack_fb0 * fVar182 - fStack_fa0 * fStack_fd0);
        auVar143._12_4_ = ~uVar52 & (uint)(fStack_fac * fVar185 - fStack_f9c * fStack_fcc);
        auVar21._4_4_ = (uint)(fVar159 * fStack_fd4 - fVar179 * fVar189) & uVar46;
        auVar21._0_4_ = (uint)(fVar157 * local_fd8 - fVar176 * fVar188) & uVar43;
        auVar21._8_4_ = (uint)(fVar161 * fStack_fd0 - fVar182 * fVar190) & uVar49;
        auVar21._12_4_ = (uint)(fVar163 * fStack_fcc - fVar185 * fVar191) & uVar52;
        _local_1248 = auVar143 | auVar21;
        local_1238[0] =
             (float)(~uVar44 & (uint)(local_fa8 * fVar112 - fVar176 * local_fc8) |
                    (uint)(fVar176 * local_fe8 - fVar157 * fVar112) & uVar44);
        local_1238[1] =
             (float)(~uVar47 & (uint)(fStack_fa4 * fVar124 - fVar179 * fStack_fc4) |
                    (uint)(fVar179 * fStack_fe4 - fVar159 * fVar124) & uVar47);
        local_1238[2] =
             (float)(~uVar50 & (uint)(fStack_fa0 * fVar187 - fVar182 * fStack_fc0) |
                    (uint)(fVar182 * fStack_fe0 - fVar161 * fVar187) & uVar50);
        local_1238[3] =
             (float)(~uVar53 & (uint)(fStack_f9c * fVar125 - fVar185 * fStack_fbc) |
                    (uint)(fVar185 * fStack_fdc - fVar163 * fVar125) & uVar53);
        fVar95 = fVar169 * local_1258[0] + fVar94 * local_1248._0_4_ + fVar165 * local_1238[0];
        fVar67 = fVar169 * local_1258[1] + fVar94 * local_1248._4_4_ + fVar165 * local_1238[1];
        fVar91 = fVar169 * local_1258[2] + fVar94 * local_1248._8_4_ + fVar165 * local_1238[2];
        fVar93 = fVar169 * local_1258[3] + fVar94 * local_1248._12_4_ + fVar165 * local_1238[3];
        auVar100._0_4_ = fVar95 + fVar95;
        auVar100._4_4_ = fVar67 + fVar67;
        auVar100._8_4_ = fVar91 + fVar91;
        auVar100._12_4_ = fVar93 + fVar93;
        auVar55._0_4_ = fVar156 * local_1238[0];
        auVar55._4_4_ = fVar158 * local_1238[1];
        auVar55._8_4_ = fVar160 * local_1238[2];
        auVar55._12_4_ = fVar162 * local_1238[3];
        fVar112 = fVar126 * local_1258[0] + local_f98 * local_1248._0_4_ + auVar55._0_4_;
        fVar124 = fVar135 * local_1258[1] + fStack_f94 * local_1248._4_4_ + auVar55._4_4_;
        fVar187 = fVar137 * local_1258[2] + fStack_f90 * local_1248._8_4_ + auVar55._8_4_;
        fVar125 = fVar150 * local_1258[3] + fStack_f8c * local_1248._12_4_ + auVar55._12_4_;
        auVar141 = rcpps(auVar55,auVar100);
        fVar95 = auVar141._0_4_;
        fVar67 = auVar141._4_4_;
        fVar91 = auVar141._8_4_;
        fVar93 = auVar141._12_4_;
        fVar112 = ((1.0 - auVar100._0_4_ * fVar95) * fVar95 + fVar95) * (fVar112 + fVar112);
        fVar124 = ((1.0 - auVar100._4_4_ * fVar67) * fVar67 + fVar67) * (fVar124 + fVar124);
        fVar91 = ((1.0 - auVar100._8_4_ * fVar91) * fVar91 + fVar91) * (fVar187 + fVar187);
        fVar93 = ((1.0 - auVar100._12_4_ * fVar93) * fVar93 + fVar93) * (fVar125 + fVar125);
        fVar95 = *(float *)(ray + k * 4 + 0x80);
        local_13c8 = ZEXT416((uint)fVar95);
        fVar67 = *(float *)(ray + k * 4 + 0x30);
        auVar56._0_4_ = -(uint)(fVar112 <= fVar95 && fVar67 <= fVar112) & auVar168._0_4_;
        auVar56._4_4_ = -(uint)(fVar124 <= fVar95 && fVar67 <= fVar124) & auVar168._4_4_;
        auVar56._8_4_ = -(uint)(fVar91 <= fVar95 && fVar67 <= fVar91) & auVar168._8_4_;
        auVar56._12_4_ = -(uint)(fVar93 <= fVar95 && fVar67 <= fVar93) & auVar168._12_4_;
        iVar29 = movmskps(iVar29,auVar56);
        if (iVar29 == 0) goto LAB_00657295;
        valid.field_0.i[0] = auVar56._0_4_ & -(uint)(auVar100._0_4_ != 0.0);
        valid.field_0.i[1] = auVar56._4_4_ & -(uint)(auVar100._4_4_ != 0.0);
        valid.field_0.i[2] = auVar56._8_4_ & -(uint)(auVar100._8_4_ != 0.0);
        valid.field_0.i[3] = auVar56._12_4_ & -(uint)(auVar100._12_4_ != 0.0);
        uVar28 = movmskps(iVar29,(undefined1  [16])valid.field_0);
        auVar104._4_4_ = fStack_1204;
        auVar104._0_4_ = local_1208;
        auVar104._8_4_ = fStack_1200;
        auVar104._12_4_ = fStack_11fc;
        if (uVar28 != 0) {
          auVar27._4_4_ = fVar154;
          auVar27._0_4_ = fVar153;
          auVar27._8_4_ = fVar155;
          auVar27._12_4_ = fVar152;
          local_1268[0] = fVar112;
          local_1268[1] = fVar124;
          local_1268[2] = fVar91;
          local_1268[3] = fVar93;
          local_1228 = local_10b8._0_4_;
          uStack_1224 = local_10b8._4_4_;
          uStack_1220 = local_10b8._8_4_;
          uStack_121c = local_10b8._12_4_;
          auVar141 = rcpps(auVar104,auVar27);
          fVar95 = auVar141._0_4_;
          fVar92 = auVar141._4_4_;
          fVar94 = auVar141._8_4_;
          fVar165 = auVar141._12_4_;
          fVar187 = DAT_01f46a60._4_4_;
          fVar125 = DAT_01f46a60._12_4_;
          fVar169 = (float)DAT_01f46a60;
          fVar67 = DAT_01f46a60._8_4_;
          fVar95 = (float)(-(uint)(1e-18 <= ABS(fVar153)) &
                          (uint)((fVar169 - fVar153 * fVar95) * fVar95 + fVar95));
          fVar92 = (float)(-(uint)(1e-18 <= ABS(fVar154)) &
                          (uint)((fVar187 - fVar154 * fVar92) * fVar92 + fVar92));
          fVar94 = (float)(-(uint)(1e-18 <= ABS(fVar155)) &
                          (uint)((fVar67 - fVar155 * fVar94) * fVar94 + fVar94));
          fVar165 = (float)(-(uint)(1e-18 <= ABS(fVar152)) &
                           (uint)((fVar125 - fVar152 * fVar165) * fVar165 + fVar165));
          auVar132._0_4_ = fVar127 * fVar95;
          auVar132._4_4_ = fVar136 * fVar92;
          auVar132._8_4_ = tNear.field_0.v[2] * fVar94;
          auVar132._12_4_ = tNear.field_0.v[3] * fVar165;
          auVar167 = minps(auVar132,_DAT_01f46a60);
          auVar72._0_4_ = fVar95 * local_1028._0_4_;
          auVar72._4_4_ = fVar92 * local_1028._4_4_;
          auVar72._8_4_ = fVar94 * local_1028._8_4_;
          auVar72._12_4_ = fVar165 * local_1028._12_4_;
          auVar141 = minps(auVar72,_DAT_01f46a60);
          auVar101._0_4_ = (uint)(fVar169 - auVar167._0_4_) & local_10b8._0_4_;
          auVar101._4_4_ = (uint)(fVar187 - auVar167._4_4_) & local_10b8._4_4_;
          auVar101._8_4_ = (uint)(fVar67 - auVar167._8_4_) & local_10b8._8_4_;
          auVar101._12_4_ = (uint)(fVar125 - auVar167._12_4_) & local_10b8._12_4_;
          auVar133._0_4_ = (uint)auVar167._0_4_ & local_10d8._0_4_;
          auVar133._4_4_ = (uint)auVar167._4_4_ & local_10d8._4_4_;
          auVar133._8_4_ = (uint)auVar167._8_4_ & local_10d8._8_4_;
          auVar133._12_4_ = (uint)auVar167._12_4_ & local_10d8._12_4_;
          local_1288 = auVar133 | auVar101;
          local_1278._4_4_ =
               (uint)auVar141._4_4_ & local_10d8._4_4_ |
               (uint)(fVar187 - auVar141._4_4_) & local_10b8._4_4_;
          local_1278._0_4_ =
               (uint)auVar141._0_4_ & local_10d8._0_4_ |
               (uint)(fVar169 - auVar141._0_4_) & local_10b8._0_4_;
          local_1278._8_4_ =
               (uint)auVar141._8_4_ & local_10d8._8_4_ |
               (uint)(fVar67 - auVar141._8_4_) & local_10b8._8_4_;
          local_1278._12_4_ =
               (uint)auVar141._12_4_ & local_10d8._12_4_ |
               (uint)(fVar125 - auVar141._12_4_) & local_10b8._12_4_;
          auVar73._0_4_ = (uint)fVar112 & valid.field_0.i[0];
          auVar73._4_4_ = (uint)fVar124 & valid.field_0.i[1];
          auVar73._8_4_ = (uint)fVar91 & valid.field_0.i[2];
          auVar73._12_4_ = (uint)fVar93 & valid.field_0.i[3];
          auVar102._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
          auVar102._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
          auVar102._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
          auVar102 = auVar102 | auVar73;
          auVar117._4_4_ = auVar102._0_4_;
          auVar117._0_4_ = auVar102._4_4_;
          auVar117._8_4_ = auVar102._12_4_;
          auVar117._12_4_ = auVar102._8_4_;
          auVar141 = minps(auVar117,auVar102);
          auVar74._0_8_ = auVar141._8_8_;
          auVar74._8_4_ = auVar141._0_4_;
          auVar74._12_4_ = auVar141._4_4_;
          auVar141 = minps(auVar74,auVar141);
          auVar75._0_8_ =
               CONCAT44(-(uint)(auVar141._4_4_ == auVar102._4_4_) & valid.field_0.i[1],
                        -(uint)(auVar141._0_4_ == auVar102._0_4_) & valid.field_0.i[0]);
          auVar75._8_4_ = -(uint)(auVar141._8_4_ == auVar102._8_4_) & valid.field_0.i[2];
          auVar75._12_4_ = -(uint)(auVar141._12_4_ == auVar102._12_4_) & valid.field_0.i[3];
          iVar29 = movmskps(uVar28,auVar75);
          aVar57 = valid.field_0;
          if (iVar29 != 0) {
            aVar57.i[2] = auVar75._8_4_;
            aVar57._0_8_ = auVar75._0_8_;
            aVar57.i[3] = auVar75._12_4_;
          }
          uVar30 = movmskps(iVar29,(undefined1  [16])aVar57);
          uVar42 = CONCAT44((int)((ulong)lVar32 >> 0x20),uVar30);
          lVar32 = 0;
          local_13a8 = fVar175;
          fStack_13a4 = fVar178;
          fStack_13a0 = fVar181;
          fStack_139c = fVar184;
          if (uVar42 != 0) {
            for (; (uVar42 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
LAB_006561d7:
          uVar28 = puVar38[lVar32];
          uVar42 = (ulong)uVar28;
          pGVar19 = (pSVar13->geometries).items[uVar42].ptr;
          if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[lVar32] = 0.0;
LAB_0065657a:
            uVar28 = movmskps((int)uVar42,(undefined1  [16])valid.field_0);
            if (uVar28 == 0) goto LAB_006566f0;
            uVar43 = valid.field_0._0_4_;
            uVar44 = valid.field_0._4_4_;
            uVar45 = valid.field_0._8_4_;
            uVar46 = valid.field_0._12_4_;
            auVar77._0_4_ = uVar43 & (uint)fVar112;
            auVar77._4_4_ = uVar44 & (uint)fVar124;
            auVar77._8_4_ = uVar45 & (uint)fVar91;
            auVar77._12_4_ = uVar46 & (uint)fVar93;
            auVar103._0_8_ = CONCAT44(~uVar44,~uVar43) & 0x7f8000007f800000;
            auVar103._8_4_ = ~uVar45 & 0x7f800000;
            auVar103._12_4_ = ~uVar46 & 0x7f800000;
            auVar103 = auVar103 | auVar77;
            auVar118._4_4_ = auVar103._0_4_;
            auVar118._0_4_ = auVar103._4_4_;
            auVar118._8_4_ = auVar103._12_4_;
            auVar118._12_4_ = auVar103._8_4_;
            auVar141 = minps(auVar118,auVar103);
            auVar78._0_8_ = auVar141._8_8_;
            auVar78._8_4_ = auVar141._0_4_;
            auVar78._12_4_ = auVar141._4_4_;
            auVar141 = minps(auVar78,auVar141);
            auVar79._0_8_ =
                 CONCAT44(-(uint)(auVar141._4_4_ == auVar103._4_4_) & uVar44,
                          -(uint)(auVar141._0_4_ == auVar103._0_4_) & uVar43);
            auVar79._8_4_ = -(uint)(auVar141._8_4_ == auVar103._8_4_) & uVar45;
            auVar79._12_4_ = -(uint)(auVar141._12_4_ == auVar103._12_4_) & uVar46;
            iVar29 = movmskps(uVar28,auVar79);
            aVar59 = valid.field_0;
            if (iVar29 != 0) {
              aVar59.i[2] = auVar79._8_4_;
              aVar59._0_8_ = auVar79._0_8_;
              aVar59.i[3] = auVar79._12_4_;
            }
            uVar30 = movmskps(iVar29,(undefined1  [16])aVar59);
            uVar42 = CONCAT44((int)(uVar42 >> 0x20),uVar30);
            lVar32 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            goto LAB_006561d7;
          }
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1148 = *(undefined4 *)(local_1288 + lVar32 * 4);
            local_1138 = local_1268[lVar32 + -4];
            local_1178._4_4_ = local_1258[lVar32];
            local_1168._4_4_ = local_1238[lVar32 + -4];
            local_1118._4_4_ = uVar28;
            local_1118._0_4_ = uVar28;
            local_1118._8_4_ = uVar28;
            local_1118._12_4_ = uVar28;
            uVar30 = *(undefined4 *)(lVar20 + 0x50 + lVar32 * 4);
            local_1128._4_4_ = uVar30;
            local_1128._0_4_ = uVar30;
            local_1128._8_4_ = uVar30;
            local_1128._12_4_ = uVar30;
            local_1158._4_4_ = local_1238[lVar32];
            local_1178._0_4_ = local_1178._4_4_;
            fStack_1170 = (float)local_1178._4_4_;
            fStack_116c = (float)local_1178._4_4_;
            local_1168._0_4_ = local_1168._4_4_;
            fStack_1160 = (float)local_1168._4_4_;
            fStack_115c = (float)local_1168._4_4_;
            local_1158._0_4_ = local_1158._4_4_;
            fStack_1150 = (float)local_1158._4_4_;
            fStack_114c = (float)local_1158._4_4_;
            uStack_1144 = local_1148;
            uStack_1140 = local_1148;
            uStack_113c = local_1148;
            fStack_1134 = local_1138;
            fStack_1130 = local_1138;
            fStack_112c = local_1138;
            local_1108 = context->user->instID[0];
            uStack_1104 = local_1108;
            uStack_1100 = local_1108;
            uStack_10fc = local_1108;
            local_10f8 = context->user->instPrimID[0];
            uStack_10f4 = local_10f8;
            uStack_10f0 = local_10f8;
            uStack_10ec = local_10f8;
            *(float *)(ray + k * 4 + 0x80) = local_1268[lVar32];
            local_13b8 = *(undefined1 (*) [16])
                          (mm_lookupmask_ps + (long)(1 << (bVar35 & 0x1f)) * 0x10);
            args.valid = (int *)local_13b8;
            args.geometryUserPtr = pGVar19->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1178;
            args.N = 4;
            p_Var33 = pGVar19->intersectionFilterN;
            args.ray = (RTCRayN *)ray;
            if (p_Var33 != (RTCFilterFunctionN)0x0) {
              p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
              k = local_13f8;
            }
            auVar76._0_4_ = -(uint)(local_13b8._0_4_ == 0);
            auVar76._4_4_ = -(uint)(local_13b8._4_4_ == 0);
            auVar76._8_4_ = -(uint)(local_13b8._8_4_ == 0);
            auVar76._12_4_ = -(uint)(local_13b8._12_4_ == 0);
            uVar28 = movmskps((int)p_Var33,auVar76);
            if ((uVar28 ^ 0xf) == 0) {
              auVar76 = auVar76 ^ _DAT_01f46b70;
              pRVar34 = (RTCRayN *)(ulong)(uVar28 ^ 0xf);
            }
            else {
              p_Var33 = context->args->filter;
              if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar19->field_8).field_0x2 & 0x40) != 0))))
              {
                p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
                k = local_13f8;
              }
              auVar58._0_4_ = -(uint)(local_13b8._0_4_ == 0);
              auVar58._4_4_ = -(uint)(local_13b8._4_4_ == 0);
              auVar58._8_4_ = -(uint)(local_13b8._8_4_ == 0);
              auVar58._12_4_ = -(uint)(local_13b8._12_4_ == 0);
              auVar76 = auVar58 ^ _DAT_01f46b70;
              uVar28 = movmskps((int)p_Var33,auVar58);
              pRVar34 = (RTCRayN *)(ulong)(uVar28 ^ 0xf);
              if ((uVar28 ^ 0xf) != 0) {
                uVar28 = *(uint *)(args.hit + 4);
                uVar43 = *(uint *)(args.hit + 8);
                uVar44 = *(uint *)(args.hit + 0xc);
                *(uint *)(args.ray + 0xc0) =
                     ~auVar58._0_4_ & *(uint *)args.hit | *(uint *)(args.ray + 0xc0) & auVar58._0_4_
                ;
                *(uint *)(args.ray + 0xc4) =
                     ~auVar58._4_4_ & uVar28 | *(uint *)(args.ray + 0xc4) & auVar58._4_4_;
                *(uint *)(args.ray + 200) =
                     ~auVar58._8_4_ & uVar43 | *(uint *)(args.ray + 200) & auVar58._8_4_;
                *(uint *)(args.ray + 0xcc) =
                     ~auVar58._12_4_ & uVar44 | *(uint *)(args.ray + 0xcc) & auVar58._12_4_;
                uVar28 = *(uint *)(args.hit + 0x14);
                uVar43 = *(uint *)(args.hit + 0x18);
                uVar44 = *(uint *)(args.hit + 0x1c);
                *(uint *)(args.ray + 0xd0) =
                     ~auVar58._0_4_ & *(uint *)(args.hit + 0x10) |
                     *(uint *)(args.ray + 0xd0) & auVar58._0_4_;
                *(uint *)(args.ray + 0xd4) =
                     ~auVar58._4_4_ & uVar28 | *(uint *)(args.ray + 0xd4) & auVar58._4_4_;
                *(uint *)(args.ray + 0xd8) =
                     ~auVar58._8_4_ & uVar43 | *(uint *)(args.ray + 0xd8) & auVar58._8_4_;
                *(uint *)(args.ray + 0xdc) =
                     ~auVar58._12_4_ & uVar44 | *(uint *)(args.ray + 0xdc) & auVar58._12_4_;
                *(undefined1 (*) [16])(args.ray + 0xe0) =
                     ~auVar58 & *(undefined1 (*) [16])(args.hit + 0x20) |
                     *(undefined1 (*) [16])(args.ray + 0xe0) & auVar58;
                *(undefined1 (*) [16])(args.ray + 0xf0) =
                     ~auVar58 & *(undefined1 (*) [16])(args.hit + 0x30) |
                     *(undefined1 (*) [16])(args.ray + 0xf0) & auVar58;
                uVar28 = *(uint *)(args.hit + 0x44);
                uVar43 = *(uint *)(args.hit + 0x48);
                uVar44 = *(uint *)(args.hit + 0x4c);
                *(uint *)(args.ray + 0x100) =
                     ~auVar58._0_4_ & *(uint *)(args.hit + 0x40) |
                     *(uint *)(args.ray + 0x100) & auVar58._0_4_;
                *(uint *)(args.ray + 0x104) =
                     ~auVar58._4_4_ & uVar28 | *(uint *)(args.ray + 0x104) & auVar58._4_4_;
                *(uint *)(args.ray + 0x108) =
                     ~auVar58._8_4_ & uVar43 | *(uint *)(args.ray + 0x108) & auVar58._8_4_;
                *(uint *)(args.ray + 0x10c) =
                     ~auVar58._12_4_ & uVar44 | *(uint *)(args.ray + 0x10c) & auVar58._12_4_;
                uVar28 = *(uint *)(args.hit + 0x54);
                uVar43 = *(uint *)(args.hit + 0x58);
                uVar44 = *(uint *)(args.hit + 0x5c);
                *(uint *)(args.ray + 0x110) =
                     *(uint *)(args.ray + 0x110) & auVar58._0_4_ |
                     ~auVar58._0_4_ & *(uint *)(args.hit + 0x50);
                *(uint *)(args.ray + 0x114) =
                     *(uint *)(args.ray + 0x114) & auVar58._4_4_ | ~auVar58._4_4_ & uVar28;
                *(uint *)(args.ray + 0x118) =
                     *(uint *)(args.ray + 0x118) & auVar58._8_4_ | ~auVar58._8_4_ & uVar43;
                *(uint *)(args.ray + 0x11c) =
                     *(uint *)(args.ray + 0x11c) & auVar58._12_4_ | ~auVar58._12_4_ & uVar44;
                uVar28 = *(uint *)(args.hit + 100);
                uVar43 = *(uint *)(args.hit + 0x68);
                uVar44 = *(uint *)(args.hit + 0x6c);
                *(uint *)(args.ray + 0x120) =
                     *(uint *)(args.ray + 0x120) & auVar58._0_4_ |
                     ~auVar58._0_4_ & *(uint *)(args.hit + 0x60);
                *(uint *)(args.ray + 0x124) =
                     *(uint *)(args.ray + 0x124) & auVar58._4_4_ | ~auVar58._4_4_ & uVar28;
                *(uint *)(args.ray + 0x128) =
                     *(uint *)(args.ray + 0x128) & auVar58._8_4_ | ~auVar58._8_4_ & uVar43;
                *(uint *)(args.ray + 300) =
                     *(uint *)(args.ray + 300) & auVar58._12_4_ | ~auVar58._12_4_ & uVar44;
                uVar28 = *(uint *)(args.hit + 0x74);
                uVar43 = *(uint *)(args.hit + 0x78);
                uVar44 = *(uint *)(args.hit + 0x7c);
                *(uint *)(args.ray + 0x130) =
                     ~auVar58._0_4_ & *(uint *)(args.hit + 0x70) |
                     *(uint *)(args.ray + 0x130) & auVar58._0_4_;
                *(uint *)(args.ray + 0x134) =
                     ~auVar58._4_4_ & uVar28 | *(uint *)(args.ray + 0x134) & auVar58._4_4_;
                *(uint *)(args.ray + 0x138) =
                     ~auVar58._8_4_ & uVar43 | *(uint *)(args.ray + 0x138) & auVar58._8_4_;
                *(uint *)(args.ray + 0x13c) =
                     ~auVar58._12_4_ & uVar44 | *(uint *)(args.ray + 0x13c) & auVar58._12_4_;
                uVar28 = *(uint *)(args.hit + 0x84);
                uVar43 = *(uint *)(args.hit + 0x88);
                uVar44 = *(uint *)(args.hit + 0x8c);
                *(uint *)(args.ray + 0x140) =
                     ~auVar58._0_4_ & *(uint *)(args.hit + 0x80) |
                     *(uint *)(args.ray + 0x140) & auVar58._0_4_;
                *(uint *)(args.ray + 0x144) =
                     ~auVar58._4_4_ & uVar28 | *(uint *)(args.ray + 0x144) & auVar58._4_4_;
                *(uint *)(args.ray + 0x148) =
                     ~auVar58._8_4_ & uVar43 | *(uint *)(args.ray + 0x148) & auVar58._8_4_;
                *(uint *)(args.ray + 0x14c) =
                     ~auVar58._12_4_ & uVar44 | *(uint *)(args.ray + 0x14c) & auVar58._12_4_;
                pRVar34 = args.ray;
              }
            }
            auVar80._0_4_ = auVar76._0_4_ << 0x1f;
            auVar80._4_4_ = auVar76._4_4_ << 0x1f;
            auVar80._8_4_ = auVar76._8_4_ << 0x1f;
            auVar80._12_4_ = auVar76._12_4_ << 0x1f;
            iVar29 = movmskps((int)pRVar34,auVar80);
            uVar42 = CONCAT44((int)((ulong)pRVar34 >> 0x20),iVar29);
            if (iVar29 == 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_13c8._0_4_;
            }
            else {
              local_13c8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
              local_13c8._4_4_ = 0;
              local_13c8._8_4_ = 0;
              local_13c8._12_4_ = 0;
            }
            valid.field_0.v[lVar32] = 0.0;
            valid.field_0.i[0] = -(uint)(fVar112 <= (float)local_13c8._0_4_) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fVar124 <= (float)local_13c8._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fVar91 <= (float)local_13c8._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fVar93 <= (float)local_13c8._0_4_) & valid.field_0.i[3];
            goto LAB_0065657a;
          }
          uVar30 = *(undefined4 *)(local_1288 + lVar32 * 4);
          fVar95 = local_1268[lVar32 + -4];
          *(float *)(ray + k * 4 + 0x80) = local_1268[lVar32];
          *(float *)(ray + k * 4 + 0xc0) = local_1258[lVar32];
          *(float *)(ray + k * 4 + 0xd0) = local_1238[lVar32 + -4];
          *(float *)(ray + k * 4 + 0xe0) = local_1238[lVar32];
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
          *(float *)(ray + k * 4 + 0x100) = fVar95;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar20 + 0x50 + lVar32 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar28;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar28 = context->user->instPrimID[0];
          *(uint *)(ray + k * 4 + 0x140) = uVar28;
LAB_006566f0:
          fVar92 = *(float *)(ray + k * 4 + 0x10);
          fStack_130c = *(float *)(ray + k * 4 + 0x20);
          fVar169 = *(float *)(ray + k * 4 + 0x40);
          fVar94 = *(float *)(ray + k * 4 + 0x50);
          fVar165 = *(float *)(ray + k * 4 + 0x60);
          local_1368 = local_1018 - fVar92;
          fStack_1364 = fStack_1014 - fVar92;
          fStack_1360 = fStack_1010 - fVar92;
          fStack_135c = fStack_100c - fVar92;
          fVar175 = local_ff8 - fStack_130c;
          fVar178 = fStack_ff4 - fStack_130c;
          fVar181 = fStack_ff0 - fStack_130c;
          fVar184 = fStack_fec - fStack_130c;
          auVar104._0_4_ = local_1008 - fVar92;
          auVar104._4_4_ = fStack_1004 - fVar92;
          auVar104._8_4_ = fStack_1000 - fVar92;
          auVar104._12_4_ = fStack_ffc - fVar92;
          local_1348 = fStack_1410 - fStack_130c;
          fStack_1344 = fVar174 - fStack_130c;
          fStack_1340 = fStack_1410 - fStack_130c;
          fStack_133c = fStack_140c - fStack_130c;
          local_1338 = local_1368 + auVar104._0_4_;
          fStack_1334 = fStack_1364 + auVar104._4_4_;
          fStack_1330 = fStack_1360 + auVar104._8_4_;
          fStack_132c = fStack_135c + auVar104._12_4_;
          fStack_1324 = fVar178 + fStack_1344;
          local_1328 = fVar175 + local_1348;
          fStack_1320 = fVar181 + fStack_1340;
          fStack_131c = fVar184 + fStack_133c;
        }
      }
      local_11b8._0_4_ = (float)local_11b8 - fStack_130c;
      local_11b8._4_4_ = local_11b8._4_4_ - fStack_130c;
      fStack_11b0 = fStack_11b0 - fStack_130c;
      fStack_11ac = fStack_11ac - fStack_130c;
      local_11c8 = local_11c8 - fVar92;
      fStack_11c4 = fStack_11c4 - fVar92;
      fStack_11c0 = fStack_11c0 - fVar92;
      fStack_11bc = fStack_11bc - fVar92;
      fVar95 = *(float *)(ray + k * 4);
      fVar154 = (float)local_11d8._0_4_ - fVar95;
      fVar155 = (float)local_11d8._4_4_ - fVar95;
      fVar152 = fStack_11d0 - fVar95;
      fVar156 = fStack_11cc - fVar95;
      fVar170 = (float)local_f88 - fVar95;
      fVar171 = local_f88._4_4_ - fVar95;
      fVar172 = fStack_f80 - fVar95;
      fVar173 = fStack_f7c - fVar95;
      local_11e8 = local_11e8 - fVar95;
      fStack_11e4 = fStack_11e4 - fVar95;
      fVar153 = fStack_11e0 - fVar95;
      fVar95 = fStack_11dc - fVar95;
      local_13a8 = local_11e8 - fVar154;
      fStack_13a4 = fStack_11e4 - fVar155;
      fStack_13a0 = fVar153 - fVar152;
      fStack_139c = fVar95 - fVar156;
      fVar93 = auVar104._0_4_;
      fVar187 = auVar104._4_4_;
      fVar125 = auVar104._8_4_;
      fVar126 = auVar104._12_4_;
      fVar179 = fVar93 - local_11c8;
      fVar185 = fVar187 - fStack_11c4;
      fVar189 = fVar125 - fStack_11c0;
      fVar191 = fVar126 - fStack_11bc;
      fVar157 = local_1348 - (float)local_11b8;
      fVar159 = fStack_1344 - local_11b8._4_4_;
      fVar161 = fStack_1340 - fStack_11b0;
      fVar163 = fStack_133c - fStack_11ac;
      fVar92 = local_1368 - fVar93;
      fVar67 = fStack_1364 - fVar187;
      fVar112 = fStack_1360 - fVar125;
      fVar124 = fStack_135c - fVar126;
      fVar174 = fVar175 - local_1348;
      fVar91 = fVar178 - fStack_1344;
      fStack_1400 = fVar181 - fStack_1340;
      fStack_13fc = fVar184 - fStack_133c;
      fVar127 = fVar154 - fVar170;
      fVar135 = fVar155 - fVar171;
      fVar136 = fVar152 - fVar172;
      fVar137 = fVar156 - fVar173;
      fVar158 = local_11c8 - local_1368;
      fVar160 = fStack_11c4 - fStack_1364;
      fVar162 = fStack_11c0 - fStack_1360;
      fVar176 = fStack_11bc - fStack_135c;
      fVar182 = (float)local_11b8 - fVar175;
      fVar188 = local_11b8._4_4_ - fVar178;
      fVar190 = fStack_11b0 - fVar181;
      fVar164 = fStack_11ac - fVar184;
      fVar150 = (fVar179 * (local_1348 + (float)local_11b8) - (fVar93 + local_11c8) * fVar157) *
                fVar169 + ((local_11e8 + fVar154) * fVar157 -
                          (local_1348 + (float)local_11b8) * local_13a8) * fVar94 +
                          (local_13a8 * (fVar93 + local_11c8) - (local_11e8 + fVar154) * fVar179) *
                          fVar165;
      fVar187 = (fVar185 * (fStack_1344 + local_11b8._4_4_) - (fVar187 + fStack_11c4) * fVar159) *
                fVar169 + ((fStack_11e4 + fVar155) * fVar159 -
                          (fStack_1344 + local_11b8._4_4_) * fStack_13a4) * fVar94 +
                          (fStack_13a4 * (fVar187 + fStack_11c4) - (fStack_11e4 + fVar155) * fVar185
                          ) * fVar165;
      local_11d8 = (undefined1  [8])CONCAT44(fVar187,fVar150);
      fStack_11d0 = (fVar189 * (fStack_1340 + fStack_11b0) - (fVar125 + fStack_11c0) * fVar161) *
                    fVar169 + ((fVar153 + fVar152) * fVar161 -
                              (fStack_1340 + fStack_11b0) * fStack_13a0) * fVar94 +
                              (fStack_13a0 * (fVar125 + fStack_11c0) - (fVar153 + fVar152) * fVar189
                              ) * fVar165;
      fStack_11cc = (fVar191 * (fStack_133c + fStack_11ac) - (fVar126 + fStack_11bc) * fVar163) *
                    fVar169 + ((fVar95 + fVar156) * fVar163 -
                              (fStack_133c + fStack_11ac) * fStack_139c) * fVar94 +
                              (fStack_139c * (fVar126 + fStack_11bc) - (fVar95 + fVar156) * fVar191)
                              * fVar165;
      fVar177 = fVar170 - local_11e8;
      fVar180 = fVar171 - fStack_11e4;
      fVar183 = fVar172 - fVar153;
      fVar186 = fVar173 - fVar95;
      fVar125 = (fVar158 * (fVar175 + (float)local_11b8) - (local_1368 + local_11c8) * fVar182) *
                fVar169 + ((fVar154 + fVar170) * fVar182 - (fVar175 + (float)local_11b8) * fVar127)
                          * fVar94 +
                          (fVar127 * (local_1368 + local_11c8) - (fVar154 + fVar170) * fVar158) *
                          fVar165;
      fVar126 = (fVar160 * (fVar178 + local_11b8._4_4_) - (fStack_1364 + fStack_11c4) * fVar188) *
                fVar169 + ((fVar155 + fVar171) * fVar188 - (fVar178 + local_11b8._4_4_) * fVar135) *
                          fVar94 + (fVar135 * (fStack_1364 + fStack_11c4) -
                                   (fVar155 + fVar171) * fVar160) * fVar165;
      fVar181 = (fVar162 * (fVar181 + fStack_11b0) - (fStack_1360 + fStack_11c0) * fVar190) *
                fVar169 + ((fVar152 + fVar172) * fVar190 - (fVar181 + fStack_11b0) * fVar136) *
                          fVar94 + (fVar136 * (fStack_1360 + fStack_11c0) -
                                   (fVar152 + fVar172) * fVar162) * fVar165;
      fVar184 = (fVar176 * (fVar184 + fStack_11ac) - (fStack_135c + fStack_11bc) * fVar164) *
                fVar169 + ((fVar156 + fVar173) * fVar164 - (fVar184 + fStack_11ac) * fVar137) *
                          fVar94 + (fVar137 * (fStack_135c + fStack_11bc) -
                                   (fVar156 + fVar173) * fVar176) * fVar165;
      auVar60._0_4_ =
           (fVar92 * local_1328 - local_1338 * fVar174) * fVar169 +
           ((local_11e8 + fVar170) * fVar174 - local_1328 * fVar177) * fVar94 +
           (fVar177 * local_1338 - (local_11e8 + fVar170) * fVar92) * fVar165;
      auVar60._4_4_ =
           (fVar67 * fStack_1324 - fStack_1334 * fVar91) * fVar169 +
           ((fStack_11e4 + fVar171) * fVar91 - fStack_1324 * fVar180) * fVar94 +
           (fVar180 * fStack_1334 - (fStack_11e4 + fVar171) * fVar67) * fVar165;
      auVar60._8_4_ =
           (fVar112 * fStack_1320 - fStack_1330 * fStack_1400) * fVar169 +
           ((fVar153 + fVar172) * fStack_1400 - fStack_1320 * fVar183) * fVar94 +
           (fVar183 * fStack_1330 - (fVar153 + fVar172) * fVar112) * fVar165;
      auVar60._12_4_ =
           (fVar124 * fStack_131c - fStack_132c * fStack_13fc) * fVar169 +
           ((fVar95 + fVar173) * fStack_13fc - fStack_131c * fVar186) * fVar94 +
           (fVar186 * fStack_132c - (fVar95 + fVar173) * fVar124) * fVar165;
      local_11e8 = fVar150 + fVar125 + auVar60._0_4_;
      fStack_11e4 = fVar187 + fVar126 + auVar60._4_4_;
      fStack_11e0 = fStack_11d0 + fVar181 + auVar60._8_4_;
      fStack_11dc = fStack_11cc + fVar184 + auVar60._12_4_;
      auVar81._8_4_ = fStack_11d0;
      auVar81._0_8_ = local_11d8;
      auVar81._12_4_ = fStack_11cc;
      auVar22._4_4_ = fVar126;
      auVar22._0_4_ = fVar125;
      auVar22._8_4_ = fVar181;
      auVar22._12_4_ = fVar184;
      auVar141 = minps(auVar81,auVar22);
      auVar141 = minps(auVar141,auVar60);
      auVar23._4_4_ = fVar126;
      auVar23._0_4_ = fVar125;
      auVar23._8_4_ = fVar181;
      auVar23._12_4_ = fVar184;
      auVar167 = maxps(_local_11d8,auVar23);
      auVar167 = maxps(auVar167,auVar60);
      fVar95 = ABS(local_11e8) * 1.1920929e-07;
      fVar93 = ABS(fStack_11e4) * 1.1920929e-07;
      fVar175 = ABS(fStack_11e0) * 1.1920929e-07;
      fVar178 = ABS(fStack_11dc) * 1.1920929e-07;
      auVar144._4_4_ = -(uint)(auVar167._4_4_ <= fVar93);
      auVar144._0_4_ = -(uint)(auVar167._0_4_ <= fVar95);
      auVar144._8_4_ = -(uint)(auVar167._8_4_ <= fVar175);
      auVar144._12_4_ = -(uint)(auVar167._12_4_ <= fVar178);
      auVar82._4_4_ = -(uint)(-fVar93 <= auVar141._4_4_);
      auVar82._0_4_ = -(uint)(-fVar95 <= auVar141._0_4_);
      auVar82._8_4_ = -(uint)(-fVar175 <= auVar141._8_4_);
      auVar82._12_4_ = -(uint)(-fVar178 <= auVar141._12_4_);
      auVar144 = auVar144 | auVar82;
      iVar29 = movmskps(uVar28,auVar144);
      if (iVar29 != 0) {
        uVar28 = -(uint)(ABS(fVar92 * fVar182) <= ABS(fVar158 * fVar157));
        uVar45 = -(uint)(ABS(fVar67 * fVar188) <= ABS(fVar160 * fVar159));
        uVar48 = -(uint)(ABS(fVar112 * fVar190) <= ABS(fVar162 * fVar161));
        uVar51 = -(uint)(ABS(fVar124 * fVar164) <= ABS(fVar176 * fVar163));
        uVar43 = -(uint)(ABS(fVar127 * fVar174) <= ABS(local_13a8 * fVar182));
        uVar46 = -(uint)(ABS(fVar135 * fVar91) <= ABS(fStack_13a4 * fVar188));
        uVar49 = -(uint)(ABS(fVar136 * fStack_1400) <= ABS(fStack_13a0 * fVar190));
        uVar52 = -(uint)(ABS(fVar137 * fStack_13fc) <= ABS(fStack_139c * fVar164));
        uVar44 = -(uint)(ABS(fVar177 * fVar158) <= ABS(fVar127 * fVar179));
        uVar47 = -(uint)(ABS(fVar180 * fVar160) <= ABS(fVar135 * fVar185));
        uVar50 = -(uint)(ABS(fVar183 * fVar162) <= ABS(fVar136 * fVar189));
        uVar53 = -(uint)(ABS(fVar186 * fVar176) <= ABS(fVar137 * fVar191));
        local_1258[0] =
             (float)(~uVar28 & (uint)(fVar179 * fVar182 - fVar158 * fVar157) |
                    (uint)(fVar158 * fVar174 - fVar92 * fVar182) & uVar28);
        local_1258[1] =
             (float)(~uVar45 & (uint)(fVar185 * fVar188 - fVar160 * fVar159) |
                    (uint)(fVar160 * fVar91 - fVar67 * fVar188) & uVar45);
        local_1258[2] =
             (float)(~uVar48 & (uint)(fVar189 * fVar190 - fVar162 * fVar161) |
                    (uint)(fVar162 * fStack_1400 - fVar112 * fVar190) & uVar48);
        local_1258[3] =
             (float)(~uVar51 & (uint)(fVar191 * fVar164 - fVar176 * fVar163) |
                    (uint)(fVar176 * fStack_13fc - fVar124 * fVar164) & uVar51);
        local_1248._0_4_ =
             ~uVar43 & (uint)(fVar157 * fVar127 - local_13a8 * fVar182) |
             (uint)(fVar177 * fVar182 - fVar127 * fVar174) & uVar43;
        local_1248._4_4_ =
             ~uVar46 & (uint)(fVar159 * fVar135 - fStack_13a4 * fVar188) |
             (uint)(fVar180 * fVar188 - fVar135 * fVar91) & uVar46;
        fStack_1240 = (float)(~uVar49 & (uint)(fVar161 * fVar136 - fStack_13a0 * fVar190) |
                             (uint)(fVar183 * fVar190 - fVar136 * fStack_1400) & uVar49);
        fStack_123c = (float)(~uVar52 & (uint)(fVar163 * fVar137 - fStack_139c * fVar164) |
                             (uint)(fVar186 * fVar164 - fVar137 * fStack_13fc) & uVar52);
        local_1238[0] =
             (float)(~uVar44 & (uint)(local_13a8 * fVar158 - fVar127 * fVar179) |
                    (uint)(fVar127 * fVar92 - fVar177 * fVar158) & uVar44);
        local_1238[1] =
             (float)(~uVar47 & (uint)(fStack_13a4 * fVar160 - fVar135 * fVar185) |
                    (uint)(fVar135 * fVar67 - fVar180 * fVar160) & uVar47);
        local_1238[2] =
             (float)(~uVar50 & (uint)(fStack_13a0 * fVar162 - fVar136 * fVar189) |
                    (uint)(fVar136 * fVar112 - fVar183 * fVar162) & uVar50);
        local_1238[3] =
             (float)(~uVar53 & (uint)(fStack_139c * fVar176 - fVar137 * fVar191) |
                    (uint)(fVar137 * fVar124 - fVar186 * fVar176) & uVar53);
        fVar95 = fVar169 * local_1258[0] +
                 fVar94 * (float)local_1248._0_4_ + fVar165 * local_1238[0];
        fVar92 = fVar169 * local_1258[1] +
                 fVar94 * (float)local_1248._4_4_ + fVar165 * local_1238[1];
        fVar174 = fVar169 * local_1258[2] + fVar94 * fStack_1240 + fVar165 * local_1238[2];
        fVar94 = fVar169 * local_1258[3] + fVar94 * fStack_123c + fVar165 * local_1238[3];
        auVar151._0_4_ = fVar95 + fVar95;
        auVar151._4_4_ = fVar92 + fVar92;
        auVar151._8_4_ = fVar174 + fVar174;
        auVar151._12_4_ = fVar94 + fVar94;
        auVar83._0_4_ = local_11c8 * (float)local_1248._0_4_ + (float)local_11b8 * local_1238[0];
        auVar83._4_4_ = fStack_11c4 * (float)local_1248._4_4_ + local_11b8._4_4_ * local_1238[1];
        auVar83._8_4_ = fStack_11c0 * fStack_1240 + fStack_11b0 * local_1238[2];
        auVar83._12_4_ = fStack_11bc * fStack_123c + fStack_11ac * local_1238[3];
        fVar169 = fVar154 * local_1258[0] + auVar83._0_4_;
        fVar174 = fVar155 * local_1258[1] + auVar83._4_4_;
        fVar67 = fVar152 * local_1258[2] + auVar83._8_4_;
        fVar91 = fVar156 * local_1258[3] + auVar83._12_4_;
        auVar141 = rcpps(auVar83,auVar151);
        fVar95 = auVar141._0_4_;
        fVar92 = auVar141._4_4_;
        fVar94 = auVar141._8_4_;
        fVar165 = auVar141._12_4_;
        fVar169 = ((1.0 - auVar151._0_4_ * fVar95) * fVar95 + fVar95) * (fVar169 + fVar169);
        fVar174 = ((1.0 - auVar151._4_4_ * fVar92) * fVar92 + fVar92) * (fVar174 + fVar174);
        fVar94 = ((1.0 - auVar151._8_4_ * fVar94) * fVar94 + fVar94) * (fVar67 + fVar67);
        fVar165 = ((1.0 - auVar151._12_4_ * fVar165) * fVar165 + fVar165) * (fVar91 + fVar91);
        fVar92 = *(float *)(ray + k * 4 + 0x80);
        fVar95 = *(float *)(ray + k * 4 + 0x30);
        auVar119._4_4_ = -(uint)(fVar95 <= fVar174);
        auVar119._0_4_ = -(uint)(fVar95 <= fVar169);
        auVar119._8_4_ = -(uint)(fVar95 <= fVar94);
        auVar119._12_4_ = -(uint)(fVar95 <= fVar165);
        local_1328 = auVar144._0_4_;
        fStack_1324 = auVar144._4_4_;
        fStack_1320 = auVar144._8_4_;
        fStack_131c = auVar144._12_4_;
        auVar84._0_4_ = -(uint)(fVar169 <= fVar92 && fVar95 <= fVar169) & (uint)local_1328;
        auVar84._4_4_ = -(uint)(fVar174 <= fVar92 && fVar95 <= fVar174) & (uint)fStack_1324;
        auVar84._8_4_ = -(uint)(fVar94 <= fVar92 && fVar95 <= fVar94) & (uint)fStack_1320;
        auVar84._12_4_ = -(uint)(fVar165 <= fVar92 && fVar95 <= fVar165) & (uint)fStack_131c;
        iVar29 = movmskps(iVar29,auVar84);
        if (iVar29 != 0) {
          valid.field_0.i[0] = auVar84._0_4_ & -(uint)(auVar151._0_4_ != 0.0);
          valid.field_0.i[1] = auVar84._4_4_ & -(uint)(auVar151._4_4_ != 0.0);
          valid.field_0.i[2] = auVar84._8_4_ & -(uint)(auVar151._8_4_ != 0.0);
          valid.field_0.i[3] = auVar84._12_4_ & -(uint)(auVar151._12_4_ != 0.0);
          iVar29 = movmskps(iVar29,(undefined1  [16])valid.field_0);
          if (iVar29 != 0) {
            tNear.field_0.v[2] = fStack_11d0;
            tNear.field_0._0_8_ = local_11d8;
            tNear.field_0.v[3] = fStack_11cc;
            auVar26._4_4_ = fStack_11e4;
            auVar26._0_4_ = local_11e8;
            auVar26._8_4_ = fStack_11e0;
            auVar26._12_4_ = fStack_11dc;
            local_1268[0] = fVar169;
            local_1268[1] = fVar174;
            local_1268[2] = fVar94;
            local_1268[3] = fVar165;
            local_1228 = local_10c8._0_4_;
            uStack_1224 = local_10c8._4_4_;
            uStack_1220 = local_10c8._8_4_;
            uStack_121c = local_10c8._12_4_;
            pSVar13 = context->scene;
            auVar141 = rcpps(auVar119,auVar26);
            fVar95 = auVar141._0_4_;
            fVar67 = auVar141._4_4_;
            fVar91 = auVar141._8_4_;
            fVar93 = auVar141._12_4_;
            fVar178 = (float)DAT_01f46a60;
            fVar112 = DAT_01f46a60._4_4_;
            fVar124 = DAT_01f46a60._12_4_;
            fVar175 = DAT_01f46a60._8_4_;
            fVar95 = (float)(-(uint)(1e-18 <= ABS(local_11e8)) &
                            (uint)((fVar178 - local_11e8 * fVar95) * fVar95 + fVar95));
            fVar67 = (float)(-(uint)(1e-18 <= ABS(fStack_11e4)) &
                            (uint)((fVar112 - fStack_11e4 * fVar67) * fVar67 + fVar67));
            fVar91 = (float)(-(uint)(1e-18 <= ABS(fStack_11e0)) &
                            (uint)((fVar175 - fStack_11e0 * fVar91) * fVar91 + fVar91));
            fVar93 = (float)(-(uint)(1e-18 <= ABS(fStack_11dc)) &
                            (uint)((fVar124 - fStack_11dc * fVar93) * fVar93 + fVar93));
            auVar145._0_4_ = fVar150 * fVar95;
            auVar145._4_4_ = fVar187 * fVar67;
            auVar145._8_4_ = fStack_11d0 * fVar91;
            auVar145._12_4_ = fStack_11cc * fVar93;
            auVar167 = minps(auVar145,_DAT_01f46a60);
            auVar105._0_4_ = fVar95 * fVar125;
            auVar105._4_4_ = fVar67 * fVar126;
            auVar105._8_4_ = fVar91 * fVar181;
            auVar105._12_4_ = fVar93 * fVar184;
            auVar141 = minps(auVar105,_DAT_01f46a60);
            auVar120._0_4_ = (uint)(fVar178 - auVar167._0_4_) & local_10c8._0_4_;
            auVar120._4_4_ = (uint)(fVar112 - auVar167._4_4_) & local_10c8._4_4_;
            auVar120._8_4_ = (uint)(fVar175 - auVar167._8_4_) & local_10c8._8_4_;
            auVar120._12_4_ = (uint)(fVar124 - auVar167._12_4_) & local_10c8._12_4_;
            auVar146._0_4_ = (uint)auVar167._0_4_ & local_10e8._0_4_;
            auVar146._4_4_ = (uint)auVar167._4_4_ & local_10e8._4_4_;
            auVar146._8_4_ = (uint)auVar167._8_4_ & local_10e8._8_4_;
            auVar146._12_4_ = (uint)auVar167._12_4_ & local_10e8._12_4_;
            local_1288 = auVar146 | auVar120;
            auVar134._0_4_ = (uint)(fVar178 - auVar141._0_4_) & local_10c8._0_4_;
            auVar134._4_4_ = (uint)(fVar112 - auVar141._4_4_) & local_10c8._4_4_;
            auVar134._8_4_ = (uint)(fVar175 - auVar141._8_4_) & local_10c8._8_4_;
            auVar134._12_4_ = (uint)(fVar124 - auVar141._12_4_) & local_10c8._12_4_;
            auVar106._0_4_ = (uint)auVar141._0_4_ & local_10e8._0_4_;
            auVar106._4_4_ = (uint)auVar141._4_4_ & local_10e8._4_4_;
            auVar106._8_4_ = (uint)auVar141._8_4_ & local_10e8._8_4_;
            auVar106._12_4_ = (uint)auVar141._12_4_ & local_10e8._12_4_;
            local_1278 = auVar106 | auVar134;
            auVar61._0_4_ = (uint)fVar169 & valid.field_0.i[0];
            auVar61._4_4_ = (uint)fVar174 & valid.field_0.i[1];
            auVar61._8_4_ = (uint)fVar94 & valid.field_0.i[2];
            auVar61._12_4_ = (uint)fVar165 & valid.field_0.i[3];
            auVar107._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
            auVar107._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
            auVar107._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
            auVar107 = auVar107 | auVar61;
            auVar121._4_4_ = auVar107._0_4_;
            auVar121._0_4_ = auVar107._4_4_;
            auVar121._8_4_ = auVar107._12_4_;
            auVar121._12_4_ = auVar107._8_4_;
            auVar141 = minps(auVar121,auVar107);
            auVar62._0_8_ = auVar141._8_8_;
            auVar62._8_4_ = auVar141._0_4_;
            auVar62._12_4_ = auVar141._4_4_;
            auVar141 = minps(auVar62,auVar141);
            auVar63._0_8_ =
                 CONCAT44(-(uint)(auVar141._4_4_ == auVar107._4_4_) & valid.field_0.i[1],
                          -(uint)(auVar141._0_4_ == auVar107._0_4_) & valid.field_0.i[0]);
            auVar63._8_4_ = -(uint)(auVar141._8_4_ == auVar107._8_4_) & valid.field_0.i[2];
            auVar63._12_4_ = -(uint)(auVar141._12_4_ == auVar107._12_4_) & valid.field_0.i[3];
            iVar29 = movmskps((int)context,auVar63);
            aVar85 = valid.field_0;
            if (iVar29 != 0) {
              aVar85.i[2] = auVar63._8_4_;
              aVar85._0_8_ = auVar63._0_8_;
              aVar85.i[3] = auVar63._12_4_;
            }
            uVar30 = movmskps(iVar29,(undefined1  [16])aVar85);
            uVar42 = CONCAT44((int)((ulong)context >> 0x20),uVar30);
            lVar32 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
LAB_00656ceb:
            uVar28 = puVar38[lVar32];
            uVar42 = (ulong)uVar28;
            pGVar19 = (pSVar13->geometries).items[uVar42].ptr;
            if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar32] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar30 = *(undefined4 *)(local_1288 + lVar32 * 4);
                fVar95 = local_1268[lVar32 + -4];
                *(float *)(ray + k * 4 + 0x80) = local_1268[lVar32];
                *(float *)(ray + k * 4 + 0xc0) = local_1258[lVar32];
                *(float *)(ray + k * 4 + 0xd0) = local_1238[lVar32 + -4];
                *(float *)(ray + k * 4 + 0xe0) = local_1238[lVar32];
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
                *(float *)(ray + k * 4 + 0x100) = fVar95;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar20 + 0x50 + lVar32 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar28;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0065720d;
              }
              local_1148 = *(undefined4 *)(local_1288 + lVar32 * 4);
              local_1138 = local_1268[lVar32 + -4];
              fVar95 = local_1258[lVar32];
              fVar67 = local_1238[lVar32 + -4];
              local_1118._4_4_ = uVar28;
              local_1118._0_4_ = uVar28;
              local_1118._8_4_ = uVar28;
              local_1118._12_4_ = uVar28;
              uVar30 = *(undefined4 *)(lVar20 + 0x50 + lVar32 * 4);
              local_1128._4_4_ = uVar30;
              local_1128._0_4_ = uVar30;
              local_1128._8_4_ = uVar30;
              local_1128._12_4_ = uVar30;
              local_1178._4_4_ = fVar95;
              local_1178._0_4_ = fVar95;
              fStack_1170 = fVar95;
              fStack_116c = fVar95;
              local_1168._4_4_ = fVar67;
              local_1168._0_4_ = fVar67;
              fStack_1160 = fVar67;
              fStack_115c = fVar67;
              fVar95 = local_1238[lVar32];
              local_1158._4_4_ = fVar95;
              local_1158._0_4_ = fVar95;
              fStack_1150 = fVar95;
              fStack_114c = fVar95;
              uStack_1144 = local_1148;
              uStack_1140 = local_1148;
              uStack_113c = local_1148;
              fStack_1134 = local_1138;
              fStack_1130 = local_1138;
              fStack_112c = local_1138;
              local_1108 = context->user->instID[0];
              uStack_1104 = local_1108;
              uStack_1100 = local_1108;
              uStack_10fc = local_1108;
              local_10f8 = context->user->instPrimID[0];
              uStack_10f4 = local_10f8;
              uStack_10f0 = local_10f8;
              uStack_10ec = local_10f8;
              *(float *)(ray + k * 4 + 0x80) = local_1268[lVar32];
              local_13b8 = *(undefined1 (*) [16])
                            (mm_lookupmask_ps + (long)(1 << (bVar35 & 0x1f)) * 0x10);
              args.valid = (int *)local_13b8;
              args.geometryUserPtr = pGVar19->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_1178;
              args.N = 4;
              p_Var33 = pGVar19->intersectionFilterN;
              args.ray = (RTCRayN *)ray;
              if (p_Var33 != (RTCFilterFunctionN)0x0) {
                p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
                k = local_13f8;
              }
              auVar86._0_4_ = -(uint)(local_13b8._0_4_ == 0);
              auVar86._4_4_ = -(uint)(local_13b8._4_4_ == 0);
              auVar86._8_4_ = -(uint)(local_13b8._8_4_ == 0);
              auVar86._12_4_ = -(uint)(local_13b8._12_4_ == 0);
              uVar28 = movmskps((int)p_Var33,auVar86);
              if ((uVar28 ^ 0xf) == 0) {
                auVar86 = auVar86 ^ _DAT_01f46b70;
                pRVar34 = (RTCRayN *)(ulong)(uVar28 ^ 0xf);
              }
              else {
                p_Var33 = context->args->filter;
                if ((p_Var33 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar19->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  p_Var33 = (RTCFilterFunctionN)(*p_Var33)(&args);
                  k = local_13f8;
                }
                auVar64._0_4_ = -(uint)(local_13b8._0_4_ == 0);
                auVar64._4_4_ = -(uint)(local_13b8._4_4_ == 0);
                auVar64._8_4_ = -(uint)(local_13b8._8_4_ == 0);
                auVar64._12_4_ = -(uint)(local_13b8._12_4_ == 0);
                auVar86 = auVar64 ^ _DAT_01f46b70;
                uVar28 = movmskps((int)p_Var33,auVar64);
                pRVar34 = (RTCRayN *)(ulong)(uVar28 ^ 0xf);
                if ((uVar28 ^ 0xf) != 0) {
                  auVar108._0_4_ = *(uint *)(args.ray + 0xc0) & auVar64._0_4_;
                  auVar108._4_4_ = *(uint *)(args.ray + 0xc4) & auVar64._4_4_;
                  auVar108._8_4_ = *(uint *)(args.ray + 200) & auVar64._8_4_;
                  auVar108._12_4_ = *(uint *)(args.ray + 0xcc) & auVar64._12_4_;
                  auVar149._0_4_ = ~auVar64._0_4_ & *(uint *)args.hit;
                  auVar149._4_4_ = ~auVar64._4_4_ & *(uint *)(args.hit + 4);
                  auVar149._8_4_ = ~auVar64._8_4_ & *(uint *)(args.hit + 8);
                  auVar149._12_4_ = ~auVar64._12_4_ & *(uint *)(args.hit + 0xc);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar149 | auVar108;
                  uVar28 = *(uint *)(args.hit + 0x14);
                  uVar43 = *(uint *)(args.hit + 0x18);
                  uVar44 = *(uint *)(args.hit + 0x1c);
                  *(uint *)(args.ray + 0xd0) =
                       ~auVar64._0_4_ & *(uint *)(args.hit + 0x10) |
                       *(uint *)(args.ray + 0xd0) & auVar64._0_4_;
                  *(uint *)(args.ray + 0xd4) =
                       ~auVar64._4_4_ & uVar28 | *(uint *)(args.ray + 0xd4) & auVar64._4_4_;
                  *(uint *)(args.ray + 0xd8) =
                       ~auVar64._8_4_ & uVar43 | *(uint *)(args.ray + 0xd8) & auVar64._8_4_;
                  *(uint *)(args.ray + 0xdc) =
                       ~auVar64._12_4_ & uVar44 | *(uint *)(args.ray + 0xdc) & auVar64._12_4_;
                  *(undefined1 (*) [16])(args.ray + 0xe0) =
                       ~auVar64 & *(undefined1 (*) [16])(args.hit + 0x20) |
                       *(undefined1 (*) [16])(args.ray + 0xe0) & auVar64;
                  *(undefined1 (*) [16])(args.ray + 0xf0) =
                       ~auVar64 & *(undefined1 (*) [16])(args.hit + 0x30) |
                       *(undefined1 (*) [16])(args.ray + 0xf0) & auVar64;
                  uVar28 = *(uint *)(args.hit + 0x44);
                  uVar43 = *(uint *)(args.hit + 0x48);
                  uVar44 = *(uint *)(args.hit + 0x4c);
                  *(uint *)(args.ray + 0x100) =
                       ~auVar64._0_4_ & *(uint *)(args.hit + 0x40) |
                       *(uint *)(args.ray + 0x100) & auVar64._0_4_;
                  *(uint *)(args.ray + 0x104) =
                       ~auVar64._4_4_ & uVar28 | *(uint *)(args.ray + 0x104) & auVar64._4_4_;
                  *(uint *)(args.ray + 0x108) =
                       ~auVar64._8_4_ & uVar43 | *(uint *)(args.ray + 0x108) & auVar64._8_4_;
                  *(uint *)(args.ray + 0x10c) =
                       ~auVar64._12_4_ & uVar44 | *(uint *)(args.ray + 0x10c) & auVar64._12_4_;
                  uVar28 = *(uint *)(args.hit + 0x54);
                  uVar43 = *(uint *)(args.hit + 0x58);
                  uVar44 = *(uint *)(args.hit + 0x5c);
                  *(uint *)(args.ray + 0x110) =
                       *(uint *)(args.ray + 0x110) & auVar64._0_4_ |
                       ~auVar64._0_4_ & *(uint *)(args.hit + 0x50);
                  *(uint *)(args.ray + 0x114) =
                       *(uint *)(args.ray + 0x114) & auVar64._4_4_ | ~auVar64._4_4_ & uVar28;
                  *(uint *)(args.ray + 0x118) =
                       *(uint *)(args.ray + 0x118) & auVar64._8_4_ | ~auVar64._8_4_ & uVar43;
                  *(uint *)(args.ray + 0x11c) =
                       *(uint *)(args.ray + 0x11c) & auVar64._12_4_ | ~auVar64._12_4_ & uVar44;
                  uVar28 = *(uint *)(args.hit + 100);
                  uVar43 = *(uint *)(args.hit + 0x68);
                  uVar44 = *(uint *)(args.hit + 0x6c);
                  *(uint *)(args.ray + 0x120) =
                       *(uint *)(args.ray + 0x120) & auVar64._0_4_ |
                       ~auVar64._0_4_ & *(uint *)(args.hit + 0x60);
                  *(uint *)(args.ray + 0x124) =
                       *(uint *)(args.ray + 0x124) & auVar64._4_4_ | ~auVar64._4_4_ & uVar28;
                  *(uint *)(args.ray + 0x128) =
                       *(uint *)(args.ray + 0x128) & auVar64._8_4_ | ~auVar64._8_4_ & uVar43;
                  *(uint *)(args.ray + 300) =
                       *(uint *)(args.ray + 300) & auVar64._12_4_ | ~auVar64._12_4_ & uVar44;
                  auVar109._0_4_ = *(uint *)(args.ray + 0x130) & auVar64._0_4_;
                  auVar109._4_4_ = *(uint *)(args.ray + 0x134) & auVar64._4_4_;
                  auVar109._8_4_ = *(uint *)(args.ray + 0x138) & auVar64._8_4_;
                  auVar109._12_4_ = *(uint *)(args.ray + 0x13c) & auVar64._12_4_;
                  auVar122._0_4_ = ~auVar64._0_4_ & *(uint *)(args.hit + 0x70);
                  auVar122._4_4_ = ~auVar64._4_4_ & *(uint *)(args.hit + 0x74);
                  auVar122._8_4_ = ~auVar64._8_4_ & *(uint *)(args.hit + 0x78);
                  auVar122._12_4_ = ~auVar64._12_4_ & *(uint *)(args.hit + 0x7c);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar122 | auVar109;
                  auVar110._0_4_ = *(uint *)(args.ray + 0x140) & auVar64._0_4_;
                  auVar110._4_4_ = *(uint *)(args.ray + 0x144) & auVar64._4_4_;
                  auVar110._8_4_ = *(uint *)(args.ray + 0x148) & auVar64._8_4_;
                  auVar110._12_4_ = *(uint *)(args.ray + 0x14c) & auVar64._12_4_;
                  auVar65._0_4_ = ~auVar64._0_4_ & *(uint *)(args.hit + 0x80);
                  auVar65._4_4_ = ~auVar64._4_4_ & *(uint *)(args.hit + 0x84);
                  auVar65._8_4_ = ~auVar64._8_4_ & *(uint *)(args.hit + 0x88);
                  auVar65._12_4_ = ~auVar64._12_4_ & *(uint *)(args.hit + 0x8c);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar65 | auVar110;
                  pRVar34 = args.ray;
                }
              }
              auVar90._0_4_ = auVar86._0_4_ << 0x1f;
              auVar90._4_4_ = auVar86._4_4_ << 0x1f;
              auVar90._8_4_ = auVar86._8_4_ << 0x1f;
              auVar90._12_4_ = auVar86._12_4_ << 0x1f;
              iVar29 = movmskps((int)pRVar34,auVar90);
              uVar42 = CONCAT44((int)((ulong)pRVar34 >> 0x20),iVar29);
              if (iVar29 == 0) {
                *(float *)(ray + k * 4 + 0x80) = fVar92;
              }
              else {
                fVar92 = *(float *)(ray + k * 4 + 0x80);
              }
              valid.field_0.v[lVar32] = 0.0;
              valid.field_0.i[0] = -(uint)(fVar169 <= fVar92) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar174 <= fVar92) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar94 <= fVar92) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar165 <= fVar92) & valid.field_0.i[3];
            }
            iVar29 = movmskps((int)uVar42,(undefined1  [16])valid.field_0);
            if (iVar29 == 0) goto LAB_0065720d;
            uVar28 = valid.field_0._0_4_;
            uVar43 = valid.field_0._4_4_;
            uVar44 = valid.field_0._8_4_;
            uVar45 = valid.field_0._12_4_;
            auVar87._0_4_ = uVar28 & (uint)fVar169;
            auVar87._4_4_ = uVar43 & (uint)fVar174;
            auVar87._8_4_ = uVar44 & (uint)fVar94;
            auVar87._12_4_ = uVar45 & (uint)fVar165;
            auVar111._0_8_ = CONCAT44(~uVar43,~uVar28) & 0x7f8000007f800000;
            auVar111._8_4_ = ~uVar44 & 0x7f800000;
            auVar111._12_4_ = ~uVar45 & 0x7f800000;
            auVar111 = auVar111 | auVar87;
            auVar123._4_4_ = auVar111._0_4_;
            auVar123._0_4_ = auVar111._4_4_;
            auVar123._8_4_ = auVar111._12_4_;
            auVar123._12_4_ = auVar111._8_4_;
            auVar141 = minps(auVar123,auVar111);
            auVar88._0_8_ = auVar141._8_8_;
            auVar88._8_4_ = auVar141._0_4_;
            auVar88._12_4_ = auVar141._4_4_;
            auVar141 = minps(auVar88,auVar141);
            auVar89._0_8_ =
                 CONCAT44(-(uint)(auVar141._4_4_ == auVar111._4_4_) & uVar43,
                          -(uint)(auVar141._0_4_ == auVar111._0_4_) & uVar28);
            auVar89._8_4_ = -(uint)(auVar141._8_4_ == auVar111._8_4_) & uVar44;
            auVar89._12_4_ = -(uint)(auVar141._12_4_ == auVar111._12_4_) & uVar45;
            iVar29 = movmskps(iVar29,auVar89);
            aVar66 = valid.field_0;
            if (iVar29 != 0) {
              aVar66.i[2] = auVar89._8_4_;
              aVar66._0_8_ = auVar89._0_8_;
              aVar66.i[3] = auVar89._12_4_;
            }
            uVar30 = movmskps(iVar29,(undefined1  [16])aVar66);
            uVar42 = CONCAT44((int)(uVar42 >> 0x20),uVar30);
            lVar32 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            goto LAB_00656ceb;
          }
        }
      }
LAB_0065720d:
      auVar141 = local_1218;
      fVar95 = local_1048;
      fVar67 = fStack_1044;
      fVar91 = fStack_1040;
      fVar93 = fStack_103c;
      fVar169 = local_1088;
      fVar175 = fStack_1084;
      fVar178 = fStack_1080;
      fVar181 = fStack_107c;
      fVar174 = local_1098;
      fVar184 = fStack_1094;
      fVar112 = fStack_1090;
      fVar124 = fStack_108c;
      fVar187 = local_10a8;
      fVar125 = fStack_10a4;
      fVar126 = fStack_10a0;
      fVar127 = fStack_109c;
      fVar150 = local_1188;
      fVar135 = fStack_1184;
      fVar136 = fStack_1180;
      fVar137 = fStack_117c;
      fVar152 = local_1198;
      fVar153 = fStack_1194;
      fVar154 = fStack_1190;
      fVar155 = fStack_118c;
      fVar92 = local_1058;
      fVar156 = fStack_1054;
      fVar157 = fStack_1050;
      fVar158 = fStack_104c;
      fVar94 = local_1068;
      fVar159 = fStack_1064;
      fVar160 = fStack_1060;
      fVar161 = fStack_105c;
      fVar165 = local_1078;
      fVar162 = fStack_1074;
      fVar163 = fStack_1070;
      fVar176 = fStack_106c;
    }
    uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar167._4_4_ = uVar30;
    auVar167._0_4_ = uVar30;
    auVar167._8_4_ = uVar30;
    auVar167._12_4_ = uVar30;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }